

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stencil_strips.cpp
# Opt level: O2

int max_index(int *a,int n)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar2;
  }
  iVar3 = -1;
  uVar1 = 0xffffffff;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    if (iVar3 < a[uVar2]) {
      uVar1 = uVar2 & 0xffffffff;
      iVar3 = a[uVar2];
    }
  }
  return (int)uVar1;
}

Assistant:

int max_index(const int *a, int n) {
  int m = -1;
  int j = -1;
  for (int i = 0; i < n; i++) {
	if (a[i] > m) {
	  m = a[i];
	  j = i;
	}
  }
  return j;
}